

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::EnumValueDescriptor>
          (DescriptorBuilder *this,string *name_scope,string *element_name,OptionsType *orig_options
          ,EnumValueDescriptor *descriptor)

{
  int iVar1;
  EnumValueOptions *this_00;
  OptionsToInterpret local_c0;
  string local_60;
  EnumValueOptions *local_40;
  OptionsType *options;
  OptionsType *dummy;
  EnumValueDescriptor *descriptor_local;
  OptionsType *orig_options_local;
  string *element_name_local;
  string *name_scope_local;
  DescriptorBuilder *this_local;
  
  options = (OptionsType *)0x0;
  dummy = (OptionsType *)descriptor;
  descriptor_local = (EnumValueDescriptor *)orig_options;
  orig_options_local = (OptionsType *)element_name;
  element_name_local = name_scope;
  name_scope_local = (string *)this;
  this_00 = DescriptorPool::Tables::AllocateMessage<google::protobuf::EnumValueOptions>
                      (this->tables_,(EnumValueOptions *)0x0);
  local_40 = this_00;
  MessageLite::SerializeAsString_abi_cxx11_(&local_60,(MessageLite *)descriptor_local);
  MessageLite::ParseFromString((MessageLite *)this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  (dummy->_extensions_).extensions_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_40;
  iVar1 = EnumValueOptions::uninterpreted_option_size(local_40);
  if (0 < iVar1) {
    anon_unknown_1::OptionsToInterpret::OptionsToInterpret
              (&local_c0,element_name_local,(string *)orig_options_local,(Message *)descriptor_local
               ,&local_40->super_Message);
    std::
    vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
    ::push_back(&this->options_to_interpret_,&local_c0);
    anon_unknown_1::OptionsToInterpret::~OptionsToInterpret(&local_c0);
  }
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptionsImpl(
    const string& name_scope,
    const string& element_name,
    const typename DescriptorT::OptionsType& orig_options,
    DescriptorT* descriptor) {
  // We need to use a dummy pointer to work around a bug in older versions of
  // GCC.  Otherwise, the following two lines could be replaced with:
  //   typename DescriptorT::OptionsType* options =
  //       tables_->AllocateMessage<typename DescriptorT::OptionsType>();
  typename DescriptorT::OptionsType* const dummy = NULL;
  typename DescriptorT::OptionsType* options = tables_->AllocateMessage(dummy);
  // Avoid using MergeFrom()/CopyFrom() in this class to make it -fno-rtti
  // friendly. Without RTTI, MergeFrom() and CopyFrom() will fallback to the
  // reflection based method, which requires the Descriptor. However, we are in
  // the middle of building the descriptors, thus the deadlock.
  options->ParseFromString(orig_options.SerializeAsString());
  descriptor->options_ = options;

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(
        OptionsToInterpret(name_scope, element_name, &orig_options, options));
  }
}